

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.h
# Opt level: O2

Node<MeshLib::Face> * __thiscall
AVL::Node<MeshLib::Face>::remove_node(Node<MeshLib::Face> *this,Face *inData)

{
  int iVar1;
  int iVar2;
  Node<MeshLib::Face> *pNVar3;
  
  iVar1 = inData->m_id;
  iVar2 = this->data->m_id;
  if (iVar1 == iVar2) {
    pNVar3 = move_down_righthand_side(this->left,this->right);
    this->left = (Node<MeshLib::Face> *)0x0;
    this->right = (Node<MeshLib::Face> *)0x0;
    ~Node(this);
    operator_delete(this);
    return pNVar3;
  }
  pNVar3 = remove_node((&this->left)[iVar2 < iVar1],inData);
  (&this->left)[iVar2 < iVar1] = pNVar3;
  pNVar3 = balance(this);
  return pNVar3;
}

Assistant:

Node<T> * remove_node (T * inData)
    {
        if (this == NULL)
            return NULL;

        // we found the data we were looking for

        if ( *inData == *data)
        {
            // save the children

            Node<T> * tmp = left -> move_down_righthand_side (right);

            // by setting the children to NULL, we delete exactly one node.

            left = NULL;
            right = NULL;
            delete this;

            // return the reorganized children

            return tmp;
        }

        if ( *inData < *data)
            left = left -> remove_node (inData);
        else
            right = right -> remove_node (inData);
        return balance ();
    }